

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O2

void * AllocUnitsRare(CPpmd7 *p,uint indx)

{
  byte bVar1;
  uint uVar2;
  uint oldIndx;
  uint uVar3;
  ulong uVar4;
  Byte *pBVar5;
  Byte *pBVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  oldIndx = indx;
  if (p->GlueCount == 0) {
    uVar3 = p->Size + p->AlignOffset;
    p->GlueCount = 0xff;
    uVar8 = uVar3;
    for (lVar7 = 0; lVar7 != 0x26; lVar7 = lVar7 + 1) {
      bVar1 = p->Indx2Units[lVar7];
      uVar2 = p->FreeList[lVar7];
      p->FreeList[lVar7] = 0;
      while (uVar2 != 0) {
        pBVar5 = p->Base;
        *(uint *)(pBVar5 + (ulong)uVar2 + 4) = uVar8;
        *(uint *)(pBVar5 + (ulong)uVar8 + 8) = uVar2;
        uVar12 = *(uint *)(pBVar5 + uVar2);
        (pBVar5 + uVar2)[0] = '\0';
        (pBVar5 + uVar2)[1] = '\0';
        *(ushort *)(pBVar5 + (ulong)uVar2 + 2) = (ushort)bVar1;
        uVar8 = uVar2;
        uVar2 = uVar12;
      }
    }
    pBVar5 = p->Base;
    (pBVar5 + uVar3)[0] = '\x01';
    (pBVar5 + uVar3)[1] = '\0';
    *(uint *)(pBVar5 + (ulong)uVar3 + 4) = uVar8;
    *(uint *)(pBVar5 + (ulong)uVar8 + 8) = uVar3;
    pBVar6 = p->LoUnit;
    if (pBVar6 != p->HiUnit) {
      pBVar6[0] = '\x01';
      pBVar6[1] = '\0';
    }
    while (uVar8 != uVar3) {
      uVar4 = (ulong)uVar8;
      uVar8 = (uint)*(ushort *)(pBVar5 + uVar4 + 2);
      while ((lVar7 = (ulong)uVar8 * 0xc, *(short *)(pBVar5 + lVar7 + uVar4) == 0 &&
             (uVar8 = uVar8 + *(ushort *)(pBVar5 + lVar7 + uVar4 + 2), uVar8 < 0x10000))) {
        uVar2 = *(uint *)(pBVar5 + lVar7 + uVar4 + 4);
        uVar12 = *(uint *)(pBVar5 + lVar7 + uVar4 + 8);
        *(uint *)(pBVar5 + (ulong)uVar12 + 4) = uVar2;
        *(uint *)(pBVar5 + (ulong)uVar2 + 8) = uVar12;
        *(short *)(pBVar5 + uVar4 + 2) = (short)uVar8;
      }
      uVar8 = *(uint *)(pBVar5 + uVar4 + 4);
    }
    uVar8 = *(uint *)(pBVar5 + (ulong)uVar3 + 4);
    while (uVar8 != uVar3) {
      uVar4 = (ulong)uVar8;
      uVar2 = *(uint *)(pBVar5 + uVar4 + 4);
      uVar11 = (ulong)(*(ushort *)(pBVar5 + uVar4 + 2) - 1);
      iVar9 = 0;
      pBVar6 = pBVar5;
      for (uVar12 = (uint)*(ushort *)(pBVar5 + uVar4 + 2); 0x80 < uVar12; uVar12 = uVar12 - 0x80) {
        *(CPpmd_Void_Ref *)(pBVar6 + uVar4) = p->FreeList[0x25];
        p->FreeList[0x25] = uVar8 + iVar9;
        iVar9 = iVar9 + 0x600;
        pBVar6 = pBVar6 + 0x600;
        uVar11 = uVar11 - 0x80;
      }
      uVar10 = (ulong)p->Units2Indx[uVar11];
      if (p->Indx2Units[uVar10] != uVar12) {
        uVar10 = (ulong)(p->Units2Indx[uVar11] - 1);
        lVar7 = (ulong)p->Indx2Units[uVar10] * 0xc + uVar4;
        uVar12 = (int)uVar11 - (uint)p->Indx2Units[uVar10];
        *(CPpmd_Void_Ref *)(pBVar6 + lVar7) = p->FreeList[uVar12];
        p->FreeList[uVar12] = iVar9 + (int)lVar7;
      }
      *(CPpmd_Void_Ref *)(pBVar6 + uVar4) = p->FreeList[uVar10];
      p->FreeList[uVar10] = uVar8 + iVar9;
      uVar8 = uVar2;
    }
    uVar4 = (ulong)p->FreeList[indx];
    if (uVar4 != 0) {
      p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar5 + uVar4);
      return pBVar5 + uVar4;
    }
  }
  do {
    if (oldIndx == 0x25) {
      bVar1 = p->Indx2Units[indx];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar5 = p->UnitsStart + (ulong)bVar1 * -0xc;
        p->UnitsStart = pBVar5;
        return pBVar5;
      }
      return (void *)0x0;
    }
    oldIndx = oldIndx + 1;
    uVar4 = (ulong)p->FreeList[oldIndx];
  } while (uVar4 == 0);
  pBVar5 = p->Base + uVar4;
  p->FreeList[oldIndx] = *(CPpmd_Void_Ref *)(p->Base + uVar4);
  SplitBlock(p,pBVar5,oldIndx,indx);
  return pBVar5;
}

Assistant:

static void *AllocUnitsRare(CPpmd7 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}